

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O0

void connect_caverns(chunk_conflict *c,loc *floor)

{
  int iVar1;
  wchar_t wVar2;
  int *colors_00;
  int *counts_00;
  wchar_t spot_1;
  wchar_t spot;
  wchar_t color_of_floor [4];
  int *counts;
  int *colors;
  wchar_t size;
  wchar_t i;
  loc *floor_local;
  chunk_conflict *c_local;
  
  iVar1 = c->height * c->width;
  colors_00 = (int *)mem_zalloc((long)iVar1 << 2);
  counts_00 = (int *)mem_zalloc((long)iVar1 << 2);
  build_colors(c,colors_00,counts_00,(_Bool *)0x0,true);
  for (colors._4_4_ = 0; colors._4_4_ < 4; colors._4_4_ = colors._4_4_ + 1) {
    wVar2 = grid_to_i(floor[colors._4_4_],c->width);
    (&spot_1)[colors._4_4_] = colors_00[wVar2];
  }
  join_region(c,colors_00,counts_00,spot_1,spot,false);
  join_region(c,colors_00,counts_00,color_of_floor[0],color_of_floor[1],false);
  for (colors._4_4_ = 1; colors._4_4_ < 3; colors._4_4_ = colors._4_4_ + 1) {
    wVar2 = grid_to_i(floor[colors._4_4_],c->width);
    (&spot_1)[colors._4_4_] = colors_00[wVar2];
  }
  join_region(c,colors_00,counts_00,spot,color_of_floor[0],false);
  mem_free(colors_00);
  mem_free(counts_00);
  return;
}

Assistant:

static void connect_caverns(struct chunk *c, struct loc floor[])
{
	int i;
	int size = c->height * c->width;
	int *colors = mem_zalloc(size * sizeof(int));
	int *counts = mem_zalloc(size * sizeof(int));
	int color_of_floor[4];

	/* Color the regions, find which cavern is which color */
	build_colors(c, colors, counts, NULL, true);
	for (i = 0; i < 4; i++) {
		int spot = grid_to_i(floor[i], c->width);
		color_of_floor[i] = colors[spot];
	}

	/* Join left and upper, right and lower */
	join_region(c, colors, counts, color_of_floor[0], color_of_floor[1],
		false);
	join_region(c, colors, counts, color_of_floor[2], color_of_floor[3],
		false);

	/* Join the two big caverns */
	for (i = 1; i < 3; i++) {
		int spot = grid_to_i(floor[i], c->width);
		color_of_floor[i] = colors[spot];
	}
	join_region(c, colors, counts, color_of_floor[1], color_of_floor[2],
		false);

	mem_free(colors);
	mem_free(counts);
}